

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jas_image.c
# Opt level: O1

jas_image_fmtinfo_t * jas_image_lookupfmtbyname(char *name)

{
  int iVar1;
  jas_image_fmtinfo_t *pjVar2;
  int iVar3;
  
  if (0 < jas_image_numfmts) {
    pjVar2 = jas_image_fmtinfos;
    iVar3 = jas_image_numfmts;
    do {
      iVar1 = strcmp(pjVar2->name,name);
      if (iVar1 == 0) {
        return pjVar2;
      }
      pjVar2 = pjVar2 + 1;
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  return (jas_image_fmtinfo_t *)0x0;
}

Assistant:

const jas_image_fmtinfo_t *jas_image_lookupfmtbyname(const char *name)
{
	int i;
	const jas_image_fmtinfo_t *fmtinfo;

	for (i = 0, fmtinfo = jas_image_fmtinfos; i < jas_image_numfmts; ++i, ++fmtinfo) {
		if (!strcmp(fmtinfo->name, name)) {
			return fmtinfo;
		}
	}
	return 0;
}